

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

void __thiscall
Js::JSONStringifier::ReadProperty
          (JSONStringifier *this,JavascriptString *key,RecyclableObject *holder,JSONProperty *prop,
          Var value,JSONObjectStack *objectStack)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  Var pvVar4;
  JSONArray *ptr;
  JSONObject *ptr_00;
  RecyclableObject *local_40;
  RecyclableObject *valueObj;
  bool isObject;
  
  ThreadContext::ProbeStack(this->scriptContext->threadContext,0xc00,this->scriptContext,(PVOID)0x0)
  ;
  bVar1 = VarIs<Js::RecyclableObject>(value);
  if (bVar1) {
    pRVar3 = UnsafeVarTo<Js::RecyclableObject>(value);
    valueObj._7_1_ = '\0';
    local_40 = pRVar3;
    if (pRVar3 != (RecyclableObject *)0x0) {
      BVar2 = JavascriptOperators::IsObject(pRVar3);
      valueObj._7_1_ = BVar2 != 0;
      if ((bool)valueObj._7_1_) {
        pvVar4 = ToJSON(this,key,pRVar3);
        if (pvVar4 != (Var)0x0) {
          RecheckValue(pvVar4,&local_40,(bool *)((long)&valueObj + 7));
          value = pvVar4;
        }
      }
    }
  }
  else {
    local_40 = (RecyclableObject *)0x0;
    valueObj._7_1_ = '\0';
  }
  if (this->replacerFunction != (RecyclableObject *)0x0) {
    value = CallReplacerFunction(this,holder,key,value);
    RecheckValue(value,&local_40,(bool *)((long)&valueObj + 7));
  }
  pRVar3 = local_40;
  if (local_40 != (RecyclableObject *)0x0) {
    bVar1 = JavascriptConversion::IsCallable(local_40);
    if (bVar1) {
      BVar2 = JavascriptOperators::IsJsNativeObject(pRVar3);
      if (BVar2 != 0) {
        prop->type = Undefined;
        return;
      }
    }
    bVar1 = JavascriptOperators::IsArray(pRVar3);
    if (bVar1) {
      prop->type = Array;
      ptr = ReadArray(this,pRVar3,objectStack);
      Memory::WriteBarrierPtr<Js::JSONArray>::WriteBarrierSet
                ((WriteBarrierPtr<Js::JSONArray> *)&(prop->field_1).numericValue,ptr);
      return;
    }
    pvVar4 = TryConvertPrimitiveObject(this,pRVar3);
    if (pvVar4 != (Var)0x0) {
      RecheckValue(pvVar4,&local_40,(bool *)((long)&valueObj + 7));
      value = pvVar4;
    }
    if (valueObj._7_1_ == '\x01') {
      prop->type = Object;
      ptr_00 = ReadObject(this,local_40,objectStack);
      Memory::WriteBarrierPtr<SListCounted<Js::JSONObjectProperty,_Memory::Recycler>_>::
      WriteBarrierSet((WriteBarrierPtr<SListCounted<Js::JSONObjectProperty,_Memory::Recycler>_> *)
                      &(prop->field_1).numericValue,ptr_00);
      return;
    }
    if (local_40 != (RecyclableObject *)0x0) {
      ReadData(this,local_40,prop);
      return;
    }
  }
  ReadData(this,value,prop);
  return;
}

Assistant:

void
JSONStringifier::ReadProperty(
    _In_ JavascriptString* key,
    _In_opt_ RecyclableObject* holder,
    _Out_ JSONProperty* prop,
    _In_ Var value,
    _In_ JSONObjectStack* objectStack)
{
    PROBE_STACK(this->scriptContext, Constants::MinStackDefault);

    // Save these to avoid having to recheck conditions unless value is modified by ToJSON or a replacer function
    RecyclableObject* valueObj = JavascriptOperators::TryFromVar<RecyclableObject>(value);
    bool isObject = false;
    if (valueObj)
    {
        isObject = JavascriptOperators::IsObject(valueObj) != FALSE;
        if (isObject)
        {
            // If value is an object, we must first check if it has a ToJSON method
            Var toJSONValue = this->ToJSON(key, valueObj);
            if (toJSONValue != nullptr)
            {
                value = toJSONValue;
                RecheckValue(toJSONValue, &valueObj, &isObject);
            }
        }
    }

    // If user provided a replacer function, we need to call it
    if (this->replacerFunction != nullptr)
    {
        value = this->CallReplacerFunction(holder, key, value);
        RecheckValue(value, &valueObj, &isObject);
    }

    if (valueObj != nullptr)
    {
        // Callable JS objects are undefined, but we still stringify callable host objects
        // Host object case is for compat with old implementation, but isn't defined in the
        // spec, so we should consider removing it
        if (JavascriptConversion::IsCallable(valueObj) && JavascriptOperators::IsJsNativeObject(valueObj))
        {
            prop->type = JSONContentType::Undefined;
            return;
        }

        if (JavascriptOperators::IsArray(valueObj))
        {
            prop->type = JSONContentType::Array;
            prop->arr = this->ReadArray(valueObj, objectStack);
            return;
        }

        Var primitive = this->TryConvertPrimitiveObject(valueObj);
        if (primitive != nullptr)
        {
            value = primitive;
            RecheckValue(value, &valueObj, &isObject);
        }

        if (isObject)
        {
            prop->type = JSONContentType::Object;
            prop->obj = this->ReadObject(valueObj, objectStack);
            return;
        }

        if (valueObj != nullptr)
        {
            this->ReadData(valueObj, prop);
            return;
        }
    }
    this->ReadData(value, prop);
    return;
}